

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O3

void sf::priv::GlContext::cleanupResource(void)

{
  Lock lock;
  Lock LStack_8;
  
  Lock::Lock(&LStack_8,(Mutex *)&(anonymous_namespace)::GlContextImpl::mutex);
  (anonymous_namespace)::GlContextImpl::resourceCount =
       (anonymous_namespace)::GlContextImpl::resourceCount + -1;
  if (((anonymous_namespace)::GlContextImpl::resourceCount == 0) &&
     ((anonymous_namespace)::GlContextImpl::sharedContext != (long *)0x0)) {
    (**(code **)(*(anonymous_namespace)::GlContextImpl::sharedContext + 8))();
    (anonymous_namespace)::GlContextImpl::sharedContext = (long *)0x0;
  }
  Lock::~Lock(&LStack_8);
  return;
}

Assistant:

void GlContext::cleanupResource()
{
    using GlContextImpl::mutex;
    using GlContextImpl::resourceCount;
    using GlContextImpl::sharedContext;

    // Protect from concurrent access
    Lock lock(mutex);

    // Decrement the resources counter
    resourceCount--;

    // If there's no more resource alive, we can trigger the global context cleanup
    if (resourceCount == 0)
    {
        if (!sharedContext)
            return;

        // Destroy the shared context
        delete sharedContext;
        sharedContext = NULL;
    }
}